

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

Vec4 __thiscall glcts::SetLumSat(glcts *this,Vec4 *cbase,Vec4 *csat,Vec4 *clum)

{
  float s;
  Vec4 VVar1;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  Vector<float,_4> local_64;
  tcu local_54 [8];
  float local_4c [2];
  undefined1 local_44 [8];
  Vec4 color;
  float ssat;
  float sbase;
  float minbase;
  Vec4 *clum_local;
  Vec4 *csat_local;
  Vec4 *cbase_local;
  
  s = MinRGB(cbase);
  color.m_data[3] = Saturation(cbase);
  color.m_data[2] = Saturation(csat);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_44);
  if (color.m_data[3] <= 0.0) {
    tcu::Vector<float,_4>::Vector(&local_94,0.0);
    local_44._0_4_ = local_94.m_data[0];
    local_44._4_4_ = local_94.m_data[1];
    color.m_data[0] = local_94.m_data[2];
    color.m_data[1] = local_94.m_data[3];
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_84,s);
    tcu::operator-((tcu *)&local_74,cbase,&local_84);
    tcu::operator*((tcu *)&local_64,&local_74,color.m_data[2]);
    tcu::operator/(local_54,&local_64,color.m_data[3]);
    local_44[0] = local_54[0];
    local_44[1] = local_54[1];
    local_44[2] = local_54[2];
    local_44[3] = local_54[3];
    local_44[4] = local_54[4];
    local_44[5] = local_54[5];
    local_44[6] = local_54[6];
    local_44[7] = local_54[7];
    color.m_data[0] = local_4c[0];
    color.m_data[1] = local_4c[1];
  }
  VVar1 = SetLum(this,(Vec4 *)local_44,clum);
  return (Vec4)VVar1.m_data;
}

Assistant:

static tcu::Vec4 SetLumSat(const tcu::Vec4& cbase, const tcu::Vec4& csat, const tcu::Vec4& clum)
{
	float	 minbase = MinRGB(cbase);
	float	 sbase   = Saturation(cbase);
	float	 ssat	= Saturation(csat);
	tcu::Vec4 color;
	if (sbase > 0)
	{
		// From the extension spec:
		// Equivalent (modulo rounding errors) to setting the
		// smallest (R,G,B) component to 0, the largest to <ssat>,
		// and interpolating the "middle" component based on its
		// original value relative to the smallest/largest.
		color = (cbase - tcu::Vec4(minbase)) * ssat / sbase;
	}
	else
	{
		color = tcu::Vec4(0.0f);
	}
	return SetLum(color, clum);
}